

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_expr.cc
# Opt level: O2

void __thiscall
expr_struct_of_struct_Test::expr_struct_of_struct_Test(expr_struct_of_struct_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_002c0768;
  return;
}

Assistant:

TEST(expr, struct_of_struct) {  // NOLINT
    auto struct1 = PackedStruct("data1", {{"value1", 1, false}, {"value2", 2, false}});
    auto struct2 = std::make_shared<PackedStruct>("data2");
    auto attr = PackedStructFieldDef();
    attr.name = "value";
    attr.struct_ = &struct1;
    struct2->attributes.emplace_back(attr);

    Context c;
    auto mod = c.generator("mod");

    auto var_ = std::make_shared<VarPackedStruct>(&mod, "in", struct2);
    auto &var = *var_;

    auto &slice = var["value"]["value1"];
    auto str = slice.to_string();
    EXPECT_EQ(str, "in.value.value1");
}